

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.h
# Opt level: O2

void __thiscall HFactor::rlinkAdd(HFactor *this,HighsInt index,HighsInt count)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  
  piVar2 = (this->row_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->row_link_last).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar2[count];
  piVar3[index] = -2 - count;
  (this->row_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[index] = iVar1;
  piVar2[count] = index;
  if (-1 < (long)iVar1) {
    piVar3[iVar1] = index;
  }
  return;
}

Assistant:

void rlinkAdd(const HighsInt index, const HighsInt count) {
    const HighsInt mover = row_link_first[count];
    row_link_last[index] = -2 - count;
    row_link_next[index] = mover;
    row_link_first[count] = index;
    if (mover >= 0) row_link_last[mover] = index;
  }